

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

stringstream * __thiscall
Assimp::JSONWriter::LiteralToString(JSONWriter *this,stringstream *stream,float f)

{
  string *psVar1;
  char *__lhs;
  float fVar2;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  float local_24;
  JSONWriter *pJStack_20;
  float f_local;
  stringstream *stream_local;
  JSONWriter *this_local;
  
  local_24 = f;
  pJStack_20 = (JSONWriter *)stream;
  stream_local = (stringstream *)this;
  fVar2 = std::numeric_limits<float>::infinity();
  if ((fVar2 != ABS(local_24)) || (NAN(fVar2) || NAN(ABS(local_24)))) {
    if (NAN(local_24)) {
      if ((this->flags & 2) == 0) {
        std::operator<<((ostream *)&(pJStack_20->indent)._M_string_length,"0.0");
        this_local = pJStack_20;
      }
      else {
        std::operator<<((ostream *)&(pJStack_20->indent)._M_string_length,"\"NaN\"");
        this_local = pJStack_20;
      }
    }
    else {
      std::ostream::operator<<(&(pJStack_20->indent)._M_string_length,local_24);
      this_local = pJStack_20;
    }
  }
  else if ((this->flags & 2) == 0) {
    std::operator<<((ostream *)&(pJStack_20->indent)._M_string_length,"0.0");
    this_local = pJStack_20;
  }
  else {
    psVar1 = &pJStack_20->indent;
    __lhs = "\"";
    if (local_24 < 0.0) {
      __lhs = "\"-";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"Infinity\"",&local_69);
    std::operator+(&local_48,__lhs,&local_68);
    std::operator<<((ostream *)&psVar1->_M_string_length,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    this_local = pJStack_20;
  }
  return (stringstream *)this_local;
}

Assistant:

std::stringstream& LiteralToString(std::stringstream& stream, float f) {
        if (!std::numeric_limits<float>::is_iec559) {
            // on a non IEEE-754 platform, we make no assumptions about the representation or existence
            // of special floating-point numbers. 
            stream << f;
            return stream;
        }

        // JSON does not support writing Inf/Nan
        // [RFC 4672: "Numeric values that cannot be represented as sequences of digits
        // (such as Infinity and NaN) are not permitted."]
        // Nevertheless, many parsers will accept the special keywords Infinity, -Infinity and NaN
        if (std::numeric_limits<float>::infinity() == fabs(f)) {
            if (flags & Flag_WriteSpecialFloats) {
                stream << (f < 0 ? "\"-" : "\"") + std::string("Infinity\"");
                return stream;
            }
            //  we should print this warning, but we can't - this is called from within a generic assimp exporter, we cannot use cerr
            //	std::cerr << "warning: cannot represent infinite number literal, substituting 0 instead (use -i flag to enforce Infinity/NaN)" << std::endl;
            stream << "0.0";
            return stream;
        }
        // f!=f is the most reliable test for NaNs that I know of
        else if (f != f) {
            if (flags & Flag_WriteSpecialFloats) {
                stream << "\"NaN\"";
                return stream;
            }
            //  we should print this warning, but we can't - this is called from within a generic assimp exporter, we cannot use cerr
            //	std::cerr << "warning: cannot represent infinite number literal, substituting 0 instead (use -i flag to enforce Infinity/NaN)" << std::endl;
            stream << "0.0";
            return stream;
        }

        stream << f;
        return stream;
    }